

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderRenderingPointsCase::~GeometryShaderRenderingPointsCase
          (GeometryShaderRenderingPointsCase *this)

{
  (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderingPointsCase_021067c0;
  if (this->m_raw_array_data != (float *)0x0) {
    operator_delete__(this->m_raw_array_data);
    this->m_raw_array_data = (float *)0x0;
  }
  if (this->m_unordered_array_data != (float *)0x0) {
    operator_delete__(this->m_unordered_array_data);
    this->m_unordered_array_data = (float *)0x0;
  }
  if (this->m_unordered_elements_data != (uchar *)0x0) {
    operator_delete__(this->m_unordered_elements_data);
    this->m_unordered_elements_data = (uchar *)0x0;
  }
  (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__TestCaseBase_02104178;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->super_GeometryShaderRenderingCase).super_TestCaseBase.m_specializationMap._M_t
             );
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

GeometryShaderRenderingPointsCase::~GeometryShaderRenderingPointsCase()
{
	if (m_raw_array_data != NULL)
	{
		delete[] m_raw_array_data;

		m_raw_array_data = NULL;
	}

	if (m_unordered_array_data != NULL)
	{
		delete[] m_unordered_array_data;

		m_unordered_array_data = NULL;
	}

	if (m_unordered_elements_data != NULL)
	{
		delete[] m_unordered_elements_data;

		m_unordered_elements_data = NULL;
	}
}